

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O3

bool intgemm::anon_unknown_0::Test<intgemm::AVX512BW::Kernels16>
               (float *input_unaligned,float quant_mult,size_t size)

{
  float *input_00;
  short *psVar1;
  bool bVar2;
  IResultCapture *pIVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  float fVar7;
  AlignedVector<float> input;
  AlignedVector<short> test;
  AlignedVector<short> ref;
  char local_ed;
  float local_ec;
  AlignedVector<float> local_e8;
  AlignedVector<short> local_d8;
  AlignedVector<short> local_c8;
  double local_b8;
  SourceLineInfo local_b0;
  StringRef local_a0;
  MessageBuilder local_90;
  
  local_ec = quant_mult;
  AlignedVector<float>::AlignedVector(&local_e8,size,0x40);
  memcpy(local_e8.mem_,input_unaligned,size * 4);
  AlignedVector<short>::AlignedVector(&local_c8,size,0x40);
  AlignedVector<short>::AlignedVector(&local_d8,size,0x40);
  psVar1 = local_c8.mem_;
  input_00 = local_e8.mem_;
  if ((size & 0xffffffff) != 0) {
    uVar5 = 0;
    do {
      fVar7 = roundf(input_00[uVar5] * local_ec);
      if (fVar7 <= -32768.0) {
        fVar7 = -32768.0;
      }
      if (32767.0 <= fVar7) {
        fVar7 = 32767.0;
      }
      psVar1[uVar5] = (short)(int)fVar7;
      uVar5 = uVar5 + 1;
    } while ((size & 0xffffffff) != uVar5);
  }
  AVX512BW::Kernels16::Quantize(input_00,local_d8.mem_,local_ec,(Index)size);
  if (size == 0) {
    bVar4 = true;
  }
  else {
    local_b8 = (double)local_ec;
    bVar4 = true;
    sVar6 = 0;
    do {
      bVar2 = IsOff<short>(local_e8.mem_[sVar6] * local_ec,local_c8.mem_[sVar6],local_d8.mem_[sVar6]
                          );
      if (bVar2) {
        pIVar3 = Catch::getResultCapture();
        local_a0.m_start = anon_var_dwarf_232d86;
        local_a0.m_size = 0xd;
        local_b0.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/quantize_test.cc"
        ;
        local_b0.line = 0x5f;
        Catch::MessageBuilder::MessageBuilder(&local_90,&local_a0,&local_b0,Info);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,"Error at ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)local_90.super_MessageStream.m_stream.m_oss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," from ",6);
        std::ostream::_M_insert<double>((double)local_e8.mem_[sVar6]);
        local_ed = '*';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,&local_ed,1);
        std::ostream::_M_insert<double>(local_b8);
        local_ed = '=';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,&local_ed,1);
        std::ostream::_M_insert<double>((double)(local_e8.mem_[sVar6] * local_ec));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," ref = ",7);
        std::ostream::operator<<
                  (local_90.super_MessageStream.m_stream.m_oss,(int)local_c8.mem_[sVar6]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," test = ",8);
        std::ostream::operator<<
                  (local_90.super_MessageStream.m_stream.m_oss,(int)local_d8.mem_[sVar6]);
        (*pIVar3->_vptr_IResultCapture[8])(pIVar3,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.m_info.message._M_dataplus._M_p != &local_90.m_info.message.field_2) {
          operator_delete(local_90.m_info.message._M_dataplus._M_p);
        }
        Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_90);
        bVar4 = false;
      }
      sVar6 = sVar6 + 1;
    } while (size != sVar6);
  }
  free(local_d8.mem_);
  free(local_c8.mem_);
  free(local_e8.mem_);
  return bVar4;
}

Assistant:

bool Test(const float *input_unaligned, float quant_mult, std::size_t size) {
  using Integer = typename Backend::Integer;
  bool success = true;
  AlignedVector<float> input(size);
  std::memcpy(input.begin(), input_unaligned, sizeof(float) * size);

  AlignedVector<Integer> ref(size);
  AlignedVector<Integer> test(size);
  QuantizeRef(input.begin(), ref.begin(), quant_mult, static_cast<Index>(size));
  Backend::Quantize(input.begin(), test.begin(), quant_mult, static_cast<Index>(size));
  for (std::size_t i = 0; i < size; ++i) {
    if (IsOff(input[i] * quant_mult, ref[i], test[i])) {
      UNSCOPED_INFO("Error at " << i << " from " << input[i] << '*' << quant_mult << '=' << (input[i]*quant_mult) << " ref = " << static_cast<int>(ref[i]) << " test = " << static_cast<int>(test[i]));
      success = false;
    }
  }
  return success;
}